

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_binary.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  uint uVar1;
  bool bVar2;
  return_type rVar3;
  __type _Var4;
  Equipment EVar5;
  int16_t iVar6;
  Offset<flatbuffers::String> name_00;
  Offset<flatbuffers::String> name_01;
  uint uVar7;
  size_t buffer_minalign;
  uint8_t *buf;
  String *pSVar8;
  Vec3 *this;
  return_type pWVar9;
  float fVar10;
  string *local_308;
  string local_200;
  Weapon *local_1e0;
  Weapon *equipped;
  uint local_1b4;
  Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int> *pVStack_1b0;
  uint i;
  Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int> *weps;
  short expected_weapon_damages [2];
  string local_198 [8];
  string expected_weapon_names [2];
  Vector<unsigned_char,_unsigned_int> *inv;
  Vec3 *pos;
  Monster *local_128;
  Monster *monster;
  Offset<void> local_118;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int>_> local_114;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_110;
  Offset<flatbuffers::String> local_10c;
  offset_type local_108;
  offset_type local_104;
  Offset<MyGame::Sample::Monster> orc;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> inventory;
  uchar inv_data [10];
  Offset<flatbuffers::String> name;
  Vec3 position;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int>_> weapons;
  vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
  weapons_vector;
  Offset<MyGame::Sample::Weapon> axe;
  Offset<MyGame::Sample::Weapon> sword;
  short weapon_two_damage;
  Offset<flatbuffers::String> weapon_two_name;
  short weapon_one_damage;
  undefined1 local_98 [4];
  Offset<flatbuffers::String> weapon_one_name;
  FlatBufferBuilder builder;
  char **param_1_local;
  int param_0_local;
  
  buffer_minalign = flatbuffers::AlignOf<unsigned_long>();
  flatbuffers::FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)local_98,0x400,(Allocator *)0x0,false,buffer_minalign);
  name_00 = flatbuffers::FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                      ((FlatBufferBuilderImpl<false> *)local_98,"Sword");
  name_01 = flatbuffers::FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                      ((FlatBufferBuilderImpl<false> *)local_98,"Axe");
  axe = MyGame::Sample::CreateWeapon((FlatBufferBuilder *)local_98,name_00,3);
  weapons_vector.
  super__Vector_base<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = name_01;
  weapons_vector.
  super__Vector_base<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       MyGame::Sample::CreateWeapon((FlatBufferBuilder *)local_98,name_01,5);
  std::
  vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
  ::vector((vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
            *)&position.z_);
  std::
  vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
  ::push_back((vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
               *)&position.z_,&axe);
  std::
  vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
  ::push_back((vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
               *)&position.z_,
              (value_type *)
              ((long)&weapons_vector.
                      super__Vector_base<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  position.y_ = (float)flatbuffers::FlatBufferBuilderImpl<false>::
                       CreateVector<flatbuffers::Offset<MyGame::Sample::Weapon>,std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>>>
                                 ((FlatBufferBuilderImpl<false> *)local_98,
                                  (vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
                                   *)&position.z_);
  MyGame::Sample::Vec3::Vec3((Vec3 *)(inv_data + 8),1.0,2.0,3.0);
  inv_data._4_4_ =
       flatbuffers::FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                 ((FlatBufferBuilderImpl<false> *)local_98,"MyMonster");
  _orc = 0x706050403020100;
  inv_data[0] = '\b';
  inv_data[1] = '\t';
  local_110 = flatbuffers::FlatBufferBuilderImpl<false>::
              CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>
                        ((FlatBufferBuilderImpl<false> *)local_98,(uchar *)&orc,10);
  local_10c.o._0_1_ = inv_data[4];
  local_10c.o._1_1_ = inv_data[5];
  local_10c.o._2_1_ = inv_data[6];
  local_10c.o._3_1_ = inv_data[7];
  local_114.o = (offset_type)position.y_;
  local_104 = local_110.o;
  local_118 = flatbuffers::Offset<MyGame::Sample::Weapon>::Union
                        ((Offset<MyGame::Sample::Weapon> *)
                         ((long)&weapons_vector.
                                 super__Vector_base<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  flatbuffers::Offset<flatbuffers::Vector<const_MyGame::Sample::Vec3_*,_unsigned_int>_>::Offset
            ((Offset<flatbuffers::Vector<const_MyGame::Sample::Vec3_*,_unsigned_int>_> *)
             ((long)&monster + 4),0);
  monster._0_4_ =
       MyGame::Sample::CreateMonster
                 ((FlatBufferBuilder *)local_98,(Vec3 *)(inv_data + 8),0x96,0x50,local_10c,local_110
                  ,Color_MIN,local_114,Equipment_MAX,local_118,monster._4_4_);
  local_108 = monster._0_4_;
  flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Sample::Monster>
            ((FlatBufferBuilderImpl<false> *)local_98,monster._0_4_,(char *)0x0);
  buf = flatbuffers::FlatBufferBuilderImpl<false>::GetBufferPointer
                  ((FlatBufferBuilderImpl<false> *)local_98);
  local_128 = MyGame::Sample::GetMonster(buf);
  iVar6 = MyGame::Sample::Monster::hp(local_128);
  if (iVar6 != 0x50) {
    __assert_fail("monster->hp() == 80",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_binary.cpp"
                  ,0x45,"int main(int, const char **)");
  }
  iVar6 = MyGame::Sample::Monster::mana(local_128);
  if (iVar6 != 0x96) {
    __assert_fail("monster->mana() == 150",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_binary.cpp"
                  ,0x46,"int main(int, const char **)");
  }
  pSVar8 = MyGame::Sample::Monster::name(local_128);
  flatbuffers::String::str_abi_cxx11_((string *)&pos,pSVar8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos,
                          "MyMonster");
  if (!bVar2) {
    __assert_fail("monster->name()->str() == \"MyMonster\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_binary.cpp"
                  ,0x47,"int main(int, const char **)");
  }
  std::__cxx11::string::~string((string *)&pos);
  this = MyGame::Sample::Monster::pos(local_128);
  if (this != (Vec3 *)0x0) {
    fVar10 = MyGame::Sample::Vec3::z(this);
    if ((fVar10 != 3.0) || (NAN(fVar10))) {
      __assert_fail("pos->z() == 3.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_binary.cpp"
                    ,0x4c,"int main(int, const char **)");
    }
    expected_weapon_names[1].field_2._8_8_ = MyGame::Sample::Monster::inventory(local_128);
    if ((Vector<unsigned_char,_unsigned_int> *)expected_weapon_names[1].field_2._8_8_ ==
        (Vector<unsigned_char,_unsigned_int> *)0x0) {
      __assert_fail("inv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_binary.cpp"
                    ,0x51,"int main(int, const char **)");
    }
    rVar3 = flatbuffers::Vector<unsigned_char,_unsigned_int>::Get
                      ((Vector<unsigned_char,_unsigned_int> *)expected_weapon_names[1].field_2._8_8_
                       ,9);
    if (rVar3 == '\t') {
      weps._5_1_ = 1;
      _expected_weapon_damages = local_198;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_198,"Sword",(allocator<char> *)((long)&weps + 7));
      _expected_weapon_damages = (string *)(expected_weapon_names[0].field_2._M_local_buf + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(expected_weapon_names[0].field_2._M_local_buf + 8),"Axe",
                 (allocator<char> *)((long)&weps + 6));
      weps._5_1_ = 0;
      std::allocator<char>::~allocator((allocator<char> *)((long)&weps + 6));
      std::allocator<char>::~allocator((allocator<char> *)((long)&weps + 7));
      weps._0_4_ = 0x50003;
      pVStack_1b0 = MyGame::Sample::Monster::weapons(local_128);
      local_1b4 = 0;
      while( true ) {
        uVar1 = local_1b4;
        uVar7 = flatbuffers::Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int>::size
                          (pVStack_1b0);
        if (uVar7 <= uVar1) {
          EVar5 = MyGame::Sample::Monster::equipped_type(local_128);
          if (EVar5 != Equipment_MAX) {
            __assert_fail("monster->equipped_type() == Equipment_Weapon",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_binary.cpp"
                          ,0x61,"int main(int, const char **)");
          }
          local_1e0 = (Weapon *)MyGame::Sample::Monster::equipped(local_128);
          pSVar8 = MyGame::Sample::Weapon::name(local_1e0);
          flatbuffers::String::str_abi_cxx11_(&local_200,pSVar8);
          bVar2 = std::operator==(&local_200,"Axe");
          if (!bVar2) {
            __assert_fail("equipped->name()->str() == \"Axe\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_binary.cpp"
                          ,99,"int main(int, const char **)");
          }
          std::__cxx11::string::~string((string *)&local_200);
          iVar6 = MyGame::Sample::Weapon::damage(local_1e0);
          if (iVar6 == 5) {
            printf("The FlatBuffer was successfully created and verified!\n");
            local_308 = (string *)(expected_weapon_names[1].field_2._M_local_buf + 8);
            do {
              local_308 = local_308 + -0x20;
              std::__cxx11::string::~string(local_308);
            } while (local_308 != local_198);
            std::
            vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
            ::~vector((vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
                       *)&position.z_);
            flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl
                      ((FlatBufferBuilderImpl<false> *)local_98);
            return 0;
          }
          __assert_fail("equipped->damage() == 5",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_binary.cpp"
                        ,100,"int main(int, const char **)");
        }
        pWVar9 = flatbuffers::Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int>::Get
                           (pVStack_1b0,local_1b4);
        pSVar8 = MyGame::Sample::Weapon::name(pWVar9);
        flatbuffers::String::str_abi_cxx11_((string *)&equipped,pSVar8);
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&equipped,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&expected_weapon_names[(ulong)local_1b4 - 1].field_2 + 8));
        if (!_Var4) {
          __assert_fail("weps->Get(i)->name()->str() == expected_weapon_names[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_binary.cpp"
                        ,0x5a,"int main(int, const char **)");
        }
        std::__cxx11::string::~string((string *)&equipped);
        pWVar9 = flatbuffers::Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int>::Get
                           (pVStack_1b0,local_1b4);
        iVar6 = MyGame::Sample::Weapon::damage(pWVar9);
        if (iVar6 != expected_weapon_damages[(ulong)local_1b4 - 4]) break;
        local_1b4 = local_1b4 + 1;
      }
      __assert_fail("weps->Get(i)->damage() == expected_weapon_damages[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_binary.cpp"
                    ,0x5b,"int main(int, const char **)");
    }
    __assert_fail("inv->Get(9) == 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_binary.cpp"
                  ,0x52,"int main(int, const char **)");
  }
  __assert_fail("pos",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/samples/sample_binary.cpp"
                ,0x4b,"int main(int, const char **)");
}

Assistant:

int main(int /*argc*/, const char * /*argv*/[]) {
  // Build up a serialized buffer algorithmically:
  flatbuffers::FlatBufferBuilder builder;

  // First, lets serialize some weapons for the Monster: A 'sword' and an 'axe'.
  auto weapon_one_name = builder.CreateString("Sword");
  short weapon_one_damage = 3;

  auto weapon_two_name = builder.CreateString("Axe");
  short weapon_two_damage = 5;

  // Use the `CreateWeapon` shortcut to create Weapons with all fields set.
  auto sword = CreateWeapon(builder, weapon_one_name, weapon_one_damage);
  auto axe = CreateWeapon(builder, weapon_two_name, weapon_two_damage);

  // Create a FlatBuffer's `vector` from the `std::vector`.
  std::vector<flatbuffers::Offset<Weapon>> weapons_vector;
  weapons_vector.push_back(sword);
  weapons_vector.push_back(axe);
  auto weapons = builder.CreateVector(weapons_vector);

  // Second, serialize the rest of the objects needed by the Monster.
  auto position = Vec3(1.0f, 2.0f, 3.0f);

  auto name = builder.CreateString("MyMonster");

  unsigned char inv_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9 };
  auto inventory = builder.CreateVector(inv_data, 10);

  // Shortcut for creating monster with all fields set:
  auto orc = CreateMonster(builder, &position, 150, 80, name, inventory,
                           Color_Red, weapons, Equipment_Weapon, axe.Union());

  builder.Finish(orc);  // Serialize the root of the object.

  // We now have a FlatBuffer we can store on disk or send over a network.

  // ** file/network code goes here :) **
  // access builder.GetBufferPointer() for builder.GetSize() bytes

  // Instead, we're going to access it right away (as if we just received it).

  // Get access to the root:
  auto monster = GetMonster(builder.GetBufferPointer());

  // Get and test some scalar types from the FlatBuffer.
  assert(monster->hp() == 80);
  assert(monster->mana() == 150);  // default
  assert(monster->name()->str() == "MyMonster");

  // Get and test a field of the FlatBuffer's `struct`.
  auto pos = monster->pos();
  assert(pos);
  assert(pos->z() == 3.0f);
  (void)pos;

  // Get a test an element from the `inventory` FlatBuffer's `vector`.
  auto inv = monster->inventory();
  assert(inv);
  assert(inv->Get(9) == 9);
  (void)inv;

  // Get and test the `weapons` FlatBuffers's `vector`.
  std::string expected_weapon_names[] = { "Sword", "Axe" };
  short expected_weapon_damages[] = { 3, 5 };
  auto weps = monster->weapons();
  for (unsigned int i = 0; i < weps->size(); i++) {
    assert(weps->Get(i)->name()->str() == expected_weapon_names[i]);
    assert(weps->Get(i)->damage() == expected_weapon_damages[i]);
  }
  (void)expected_weapon_names;
  (void)expected_weapon_damages;

  // Get and test the `Equipment` union (`equipped` field).
  assert(monster->equipped_type() == Equipment_Weapon);
  auto equipped = static_cast<const Weapon *>(monster->equipped());
  assert(equipped->name()->str() == "Axe");
  assert(equipped->damage() == 5);
  (void)equipped;

  printf("The FlatBuffer was successfully created and verified!\n");
}